

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O3

int __thiscall
FCELTexture::CopyTrueColorPixels
          (FCELTexture *this,FBitmap *bitmap,int x,int y,int rotate,FCopyInfo *info)

{
  BYTE *pBVar1;
  byte *pbVar2;
  undefined4 in_register_00000084;
  ulong uVar3;
  long lVar4;
  BYTE *pixels;
  CELPalette celPalette;
  PalEntry palette [256];
  
  lVar4 = 0;
  memset(&celPalette,0,0x300);
  pixels = (BYTE *)0x0;
  anon_unknown.dwarf_93eeb3::LoadCELLump((this->super_FTexture).SourceLump,&celPalette,&pixels);
  pBVar1 = pixels;
  pbVar2 = celPalette + 2;
  do {
    palette[lVar4].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         ((uint)pbVar2[-1] << 8 | (uint)pbVar2[-2] << 0x10 | (uint)*pbVar2 | 0xff000000);
    lVar4 = lVar4 + 1;
    pbVar2 = pbVar2 + 3;
  } while (lVar4 != 0x100);
  palette[0xff].field_0.field_0.a = '\0';
  uVar3 = (ulong)(this->super_FTexture).Width;
  (*bitmap->_vptr_FBitmap[3])
            (bitmap,(ulong)(uint)x,(ulong)(uint)y,pixels,uVar3,(ulong)(this->super_FTexture).Height,
             1,uVar3,CONCAT44(in_register_00000084,rotate),palette,info);
  if (pBVar1 != (BYTE *)0x0) {
    operator_delete__(pBVar1);
  }
  return 1;
}

Assistant:

int FCELTexture::CopyTrueColorPixels(FBitmap* bitmap, int x, int y, int rotate, FCopyInfo* info)
{
	CELPalette celPalette = {};
	BYTE* pixels = NULL;

	LoadCELLump(SourceLump, celPalette, pixels);

	PalEntry palette[256];

	for (size_t i = 0; i < 256; ++i)
	{
		const BYTE* const color = &celPalette[3 * i];
		palette[i] = PalEntry(255, color[0], color[1], color[2]);
	}

	// The last palette entry is an alpha mask
	palette[255].a = 0;

	bitmap->CopyPixelData(x, y, pixels, Width, Height, 1, Width, rotate, palette, info);

	delete[] pixels;

	return 1;
}